

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimatest2.c
# Opt level: O3

int main(void)

{
  double *pdVar1;
  double *amse;
  size_t __nmemb;
  double *inp;
  sarima_object obj;
  size_t sVar2;
  long lVar3;
  double dVar4;
  double *local_40;
  double *column;
  
  local_40 = (double *)0x0;
  column = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __nmemb = read_csv_column("../data/ohlc_min.csv","Close",&local_40);
  if (__nmemb != 0) {
    sVar2 = 0;
    printf("Read %lu lines of \'%s\'\n",__nmemb,"../data/ohlc_min.csv");
    fflush(_stdout);
    inp = (double *)calloc(__nmemb,8);
    puts("Will take the logarithm");
    fflush(_stdout);
    do {
      dVar4 = log(local_40[sVar2]);
      inp[sVar2] = dVar4;
      sVar2 = sVar2 + 1;
    } while (__nmemb != sVar2);
    puts("Initializing SARIMA");
    fflush(_stdout);
    lVar3 = 0;
    obj = sarima_init(0,1,1,0xc,0,0,1,(int)__nmemb);
    sarima_setMethod(obj,0);
    puts("Will exec SARIMA");
    fflush(_stdout);
    sarima_exec(obj,inp);
    sarima_summary(obj);
    printf("Will predict %d values",5);
    fflush(_stdout);
    pdVar1 = column;
    sarima_predict(obj,inp,5,column,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",pdVar1[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    lVar3 = 0;
    printf("Standard Errors  : ");
    do {
      dVar4 = amse[lVar3];
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      printf("%g ",dVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    sarima_free(obj);
    free(local_40);
    free(inp);
    free(column);
    free(amse);
    return 0;
  }
  printf("Could not load data from file \'%s\'","../data/ohlc_min.csv");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *xpred, *amse;
	double *column = (double*)NULL;
	size_t n_rows = 0;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 0; // OBS.: not enough data for seasonal differencing
	Q = 1;

	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	n_rows = read_csv_column(INPUT_FILE, "Close", &column);
	if (0 == n_rows) {
		printf("Could not load data from file '%s'", INPUT_FILE);
		exit(100);
	}

	printf("Read %lu lines of '%s'\n", n_rows, INPUT_FILE);
	fflush(stdout);

	inp = (double*)calloc(n_rows, sizeof(double));
	//wmean = mean(temp, N);

	puts("Will take the logarithm"); fflush(stdout);
	for (i = 0; i < n_rows; ++i) {
		inp[i] = log(column[i]);
		//printf("%g \n",inp[i]);
	}

	puts("Initializing SARIMA"); fflush(stdout);
	obj = sarima_init(p, d, q, s, P, D, Q, n_rows);
	sarima_setMethod(obj, 0); 
	/** \brief Method 0 ("MLE") is default so this step is unnecessary. 
	 * The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	 **/
	 
	// sarima_setOptMethod(obj, 7);
	/** \brief Method 7 ("BFGS with More Thuente Line Search") is 
	 * default so this step is unnecessary. The method also accepts 
	 * values 0,1,2,3,4,5,6. Check the documentation for details.
	 **/

	puts("Will exec SARIMA");  fflush(stdout);
	sarima_exec(obj, inp);
	sarima_summary(obj);
	
	// Predict the next 5 values using the obtained ARIMA model
	printf("Will predict %d values", L);  fflush(stdout);
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	
	sarima_free(obj);
	free(column);
	free(inp);
	free(xpred);
	free(amse);
	
	return 0;
}